

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::write
          (BlockedRead *this,int __fd,void *__buf,size_t __n)

{
  AsyncPipe *pAVar1;
  long lVar2;
  Promise<void> PVar3;
  int iVar4;
  OwnPromiseNode node;
  void *pvVar5;
  undefined8 __n_00;
  AsyncCapabilityStream *extraout_RDX;
  undefined8 __buf_00;
  undefined4 in_register_00000034;
  BlockedRead *this_00;
  TransformPromiseNodeBase *this_01;
  undefined8 __n_01;
  undefined8 unaff_R15;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData;
  Promise<void> promise;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_67;
  Fault f;
  anon_union_32_1_a8a2e026_for_OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_2
  local_58;
  OwnPromiseNode local_38;
  
  this_00 = (BlockedRead *)CONCAT44(in_register_00000034,__fd);
  _kjCondition.value = (this_00->canceler).list.ptr == (AdapterBase *)0x0;
  if (!_kjCondition.value) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3c3,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  __n_00 = *(size_t *)((long)__buf + 8);
  moreData.ptr = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
  moreData.size_ = __n - 1;
  writeImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
             *)&f,this_00,*__buf,moreData);
  iVar4 = (int)f.exception;
  __buf_00 = extraout_RDX;
  __n_01 = (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
            *)&f;
  if ((int)f.exception == 2) {
    __n_00 = local_58._8_8_;
    __buf_00 = local_58._0_8_;
    __n_01 = local_58._24_8_;
    unaff_R15 = local_58._16_8_;
  }
  if ((int)f.exception == 1) {
    f.exception = f.exception & 0xffffffff00000000;
  }
  if (iVar4 == 2) {
    if ((Disposer *)__n_00 != (Disposer *)0x0) {
      AsyncPipe::write((AsyncPipe *)&promise,(int)this_00->pipe,(void *)__buf_00,__n_00);
      PVar3 = promise;
      if ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *)__n_01 ==
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *)0x0) {
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (_func_int **)promise.super_PromiseBase.node.ptr;
        promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
      }
      else {
        pAVar1 = this_00->pipe;
        lVar2 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
        if (lVar2 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar2) < 0x38) {
          pvVar5 = operator_new(0x400);
          this_01 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3c8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_01,(OwnPromiseNode *)&promise,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:990:35)>
                     ::anon_class_24_2_b6e2a7c2_for_func::operator());
          *(undefined ***)((long)pvVar5 + 0x3c8) = &PTR_destroy_0070a7c8;
          *(undefined8 *)((long)pvVar5 + 1000) = unaff_R15;
          *(undefined8 *)((long)pvVar5 + 0x3f0) = __n_01;
          *(AsyncPipe **)((long)pvVar5 + 0x3f8) = pAVar1;
          *(void **)((long)pvVar5 + 0x3d0) = pvVar5;
        }
        else {
          *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
          this_01 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x38);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_01,(OwnPromiseNode *)&promise,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:990:35)>
                     ::anon_class_24_2_b6e2a7c2_for_func::operator());
          *(undefined ***)((long)PVar3.super_PromiseBase.node.ptr + -0x38) = &PTR_destroy_0070a7c8;
          *(undefined8 *)((long)PVar3.super_PromiseBase.node.ptr + -0x18) = unaff_R15;
          *(undefined8 *)((long)PVar3.super_PromiseBase.node.ptr + -0x10) = __n_01;
          *(AsyncPipe **)((long)PVar3.super_PromiseBase.node.ptr + -8) = pAVar1;
          *(long *)((long)PVar3.super_PromiseBase.node.ptr + -0x30) = lVar2;
        }
        f.exception = (Exception *)&DAT_005053bd;
        local_38.ptr = &this_01->super_PromiseNode;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&_kjCondition,&local_38,(SourceLocation *)&f);
        node.ptr = local_38.ptr;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (_func_int **)CONCAT71(uStack_67,_kjCondition.value);
        if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
          local_38.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
        }
      }
      PVar3.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
      if (promise.super_PromiseBase.node.ptr == (OwnPromiseNode)0x0) {
        return (ssize_t)this;
      }
      promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar3.super_PromiseBase.node.ptr);
      return (ssize_t)this;
    }
    if ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
         *)__n_01 !=
        (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
         *)0x0) {
      AsyncPipe::write((AsyncPipe *)this,(int)this_00->pipe,(void *)unaff_R15,__n_01);
      return (ssize_t)this;
    }
  }
  else if (iVar4 != 1) {
    kj::_::unreachable();
  }
  kj::_::readyNow();
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)f.exception;
  return (ssize_t)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}